

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# spirv_msl.cpp
# Opt level: O3

void __thiscall spirv_cross::CompilerMSL::emit_mesh_outputs(CompilerMSL *this)

{
  char cVar1;
  bool bVar2;
  char cVar3;
  uint32_t uVar4;
  uint32_t uVar5;
  uint32_t uVar6;
  SPIREntryPoint *pSVar7;
  ulong uVar8;
  SPIRType *pSVar9;
  SPIRVariable *pSVar10;
  SPIRType *pSVar11;
  long *plVar12;
  undefined8 *puVar13;
  const_iterator cVar14;
  size_type *psVar15;
  uint uVar16;
  uint32_t uVar17;
  unordered_set<unsigned_int,_std::hash<unsigned_int>,_std::equal_to<unsigned_int>,_std::allocator<unsigned_int>_>
  *this_00;
  uint local_cc;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_c8;
  string local_a8;
  string access;
  uint32_t orig_index;
  string __str;
  
  pSVar7 = Compiler::get_entry_point((Compiler *)this);
  uVar16 = 0;
  if ((((pSVar7->workgroup_size).id_x == 0) && (uVar16 = 0, (pSVar7->workgroup_size).id_y == 0)) &&
     ((pSVar7->workgroup_size).id_z == 0)) {
    uVar16 = (pSVar7->workgroup_size).y * (pSVar7->workgroup_size).x * (pSVar7->workgroup_size).z;
  }
  CompilerGLSL::statement<char_const(&)[49]>
            (&this->super_CompilerGLSL,
             (char (*) [49])"threadgroup_barrier(mem_flags::mem_threadgroup);");
  CompilerGLSL::statement<char_const(&)[25]>
            (&this->super_CompilerGLSL,(char (*) [25])"if (spvMeshSizes.y == 0)");
  CompilerGLSL::begin_scope(&this->super_CompilerGLSL);
  CompilerGLSL::statement<char_const(&)[8]>(&this->super_CompilerGLSL,(char (*) [8])0x398230);
  CompilerGLSL::end_scope(&this->super_CompilerGLSL);
  CompilerGLSL::statement<char_const(&)[45]>
            (&this->super_CompilerGLSL,(char (*) [45])"spvMesh.set_primitive_count(spvMeshSizes.y);"
            );
  CompilerGLSL::statement<char_const(&)[109]>
            (&this->super_CompilerGLSL,
             (char (*) [109])
             "const uint spvThreadCount [[maybe_unused]] = (gl_WorkGroupSize.x * gl_WorkGroupSize.y * gl_WorkGroupSize.z);"
            );
  uVar8 = (ulong)(this->mesh_out_per_vertex).id;
  if (uVar8 != 0) {
    pSVar9 = Variant::get<spirv_cross::SPIRType>
                       ((this->super_CompilerGLSL).super_Compiler.ir.ids.
                        super_VectorView<spirv_cross::Variant>.ptr + uVar8);
    if (uVar16 < pSVar7->output_vertices) {
      CompilerGLSL::statement<char_const(&)[92]>
                (&this->super_CompilerGLSL,
                 (char (*) [92])
                 "for (uint spvVI = gl_LocalInvocationIndex; spvVI < spvMeshSizes.x; spvVI += spvThreadCount)"
                );
    }
    else {
      CompilerGLSL::statement<char_const(&)[44]>
                (&this->super_CompilerGLSL,
                 (char (*) [44])"const uint spvVI = gl_LocalInvocationIndex;");
      CompilerGLSL::statement<char_const(&)[46]>
                (&this->super_CompilerGLSL,
                 (char (*) [46])"if (gl_LocalInvocationIndex < spvMeshSizes.x)");
    }
    CompilerGLSL::begin_scope(&this->super_CompilerGLSL);
    CompilerGLSL::statement<char_const(&)[24]>
              (&this->super_CompilerGLSL,(char (*) [24])"spvPerVertex spvV = {};");
    if ((int)(pSVar9->member_types).super_VectorView<spirv_cross::TypedID<(spirv_cross::Types)1>_>.
             buffer_size != 0) {
      uVar17 = 0;
      do {
        uVar4 = Compiler::get_extended_member_decoration
                          ((Compiler *)this,(pSVar9->super_IVariant).self.id,uVar17,
                           SPIRVCrossDecorationInterfaceOrigID);
        uVar5 = Compiler::get_extended_member_decoration
                          ((Compiler *)this,(pSVar9->super_IVariant).self.id,uVar17,
                           SPIRVCrossDecorationInterfaceMemberIndex);
        if (uVar5 != 0xffffffff || uVar4 != 0) {
          pSVar10 = Variant::get<spirv_cross::SPIRVariable>
                              ((this->super_CompilerGLSL).super_Compiler.ir.ids.
                               super_VectorView<spirv_cross::Variant>.ptr + uVar4);
          pSVar11 = Variant::get<spirv_cross::SPIRType>
                              ((this->super_CompilerGLSL).super_Compiler.ir.ids.
                               super_VectorView<spirv_cross::Variant>.ptr +
                               *(uint *)&(pSVar10->super_IVariant).field_0xc);
          access._M_dataplus._M_p = (pointer)&access.field_2;
          access._M_string_length = 0;
          access.field_2._M_local_buf[0] = '\0';
          local_cc = 0x7fffffff;
          if (pSVar11->basetype == Struct) {
            bVar2 = Compiler::has_member_decoration
                              ((Compiler *)this,(TypeID)(pSVar11->super_IVariant).self.id,uVar5,
                               BuiltIn);
            local_cc = 0x7fffffff;
            if (bVar2) {
              local_cc = Compiler::get_member_decoration
                                   ((Compiler *)this,(TypeID)(pSVar11->super_IVariant).self.id,uVar5
                                    ,BuiltIn);
              if ((4 < local_cc) || (local_cc == 2)) goto LAB_0025b675;
              (*(this->super_CompilerGLSL).super_Compiler._vptr_Compiler[0x14])
                        (&local_a8,this,(ulong)local_cc,3);
              plVar12 = (long *)::std::__cxx11::string::replace
                                          ((ulong)&local_a8,0,(char *)0x0,0x34fc6b);
              psVar15 = (size_type *)(plVar12 + 2);
              if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)*plVar12 ==
                  (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)psVar15) {
                local_c8.field_2._M_allocated_capacity = *psVar15;
                local_c8.field_2._8_8_ = plVar12[3];
                local_c8._M_dataplus._M_p = (pointer)&local_c8.field_2;
              }
              else {
                local_c8.field_2._M_allocated_capacity = *psVar15;
                local_c8._M_dataplus._M_p = (pointer)*plVar12;
              }
              local_c8._M_string_length = plVar12[1];
              *plVar12 = (long)psVar15;
              plVar12[1] = 0;
              *(undefined1 *)(plVar12 + 2) = 0;
              ::std::__cxx11::string::operator=((string *)&access,(string *)&local_c8);
              if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)local_c8._M_dataplus._M_p != &local_c8.field_2) {
                operator_delete(local_c8._M_dataplus._M_p);
              }
              if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)local_a8._M_dataplus._M_p != &local_a8.field_2) goto LAB_0025b766;
            }
            else {
LAB_0025b675:
              CompilerGLSL::to_member_name_abi_cxx11_
                        (&local_a8,&this->super_CompilerGLSL,pSVar11,uVar5);
              puVar13 = (undefined8 *)
                        ::std::__cxx11::string::replace((ulong)&local_a8,0,(char *)0x0,0x34fc6b);
              psVar15 = puVar13 + 2;
              if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)*puVar13 ==
                  (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)psVar15) {
                local_c8.field_2._M_allocated_capacity = *psVar15;
                local_c8.field_2._8_8_ = puVar13[3];
                local_c8._M_dataplus._M_p = (pointer)&local_c8.field_2;
              }
              else {
                local_c8.field_2._M_allocated_capacity = *psVar15;
                local_c8._M_dataplus._M_p = (pointer)*puVar13;
              }
              local_c8._M_string_length = puVar13[1];
              *puVar13 = psVar15;
              puVar13[1] = 0;
              *(undefined1 *)(puVar13 + 2) = 0;
              ::std::__cxx11::string::operator=((string *)&access,(string *)&local_c8);
              if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)local_c8._M_dataplus._M_p != &local_c8.field_2) {
                operator_delete(local_c8._M_dataplus._M_p);
              }
              if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)local_a8._M_dataplus._M_p != &local_a8.field_2) {
LAB_0025b766:
                operator_delete(local_a8._M_dataplus._M_p);
              }
            }
            bVar2 = Compiler::has_member_decoration
                              ((Compiler *)this,(TypeID)(pSVar9->super_IVariant).self.id,uVar17,
                               DecorationIndex);
            if (bVar2) {
              uVar5 = Compiler::get_member_decoration
                                ((Compiler *)this,(TypeID)(pSVar9->super_IVariant).self.id,uVar17,
                                 DecorationIndex);
              cVar3 = '\x01';
              if (9 < uVar5) {
                uVar6 = uVar5;
                cVar1 = '\x04';
                do {
                  cVar3 = cVar1;
                  if (uVar6 < 100) {
                    cVar3 = cVar3 + -2;
                    goto LAB_0025b7f2;
                  }
                  if (uVar6 < 1000) {
                    cVar3 = cVar3 + -1;
                    goto LAB_0025b7f2;
                  }
                  if (uVar6 < 10000) goto LAB_0025b7f2;
                  bVar2 = 99999 < uVar6;
                  uVar6 = uVar6 / 10000;
                  cVar1 = cVar3 + '\x04';
                } while (bVar2);
                cVar3 = cVar3 + '\x01';
              }
LAB_0025b7f2:
              __str._M_dataplus._M_p = (pointer)&__str.field_2;
              orig_index = uVar5;
              ::std::__cxx11::string::_M_construct((ulong)&__str,cVar3);
              ::std::__detail::__to_chars_10_impl<unsigned_int>
                        (__str._M_dataplus._M_p,(uint)__str._M_string_length,uVar5);
              plVar12 = (long *)::std::__cxx11::string::replace
                                          ((ulong)&__str,0,(char *)0x0,0x3837e2);
              local_a8._M_dataplus._M_p = (pointer)&local_a8.field_2;
              psVar15 = (size_type *)(plVar12 + 2);
              if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)*plVar12 ==
                  (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)psVar15) {
                local_a8.field_2._M_allocated_capacity = *psVar15;
                local_a8.field_2._8_8_ = plVar12[3];
              }
              else {
                local_a8.field_2._M_allocated_capacity = *psVar15;
                local_a8._M_dataplus._M_p = (pointer)*plVar12;
              }
              local_a8._M_string_length = plVar12[1];
              *plVar12 = (long)psVar15;
              plVar12[1] = 0;
              *(undefined1 *)(plVar12 + 2) = 0;
              puVar13 = (undefined8 *)::std::__cxx11::string::append((char *)&local_a8);
              local_c8._M_dataplus._M_p = (pointer)&local_c8.field_2;
              psVar15 = puVar13 + 2;
              if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)*puVar13 ==
                  (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)psVar15) {
                local_c8.field_2._M_allocated_capacity = *psVar15;
                local_c8.field_2._8_8_ = puVar13[3];
              }
              else {
                local_c8.field_2._M_allocated_capacity = *psVar15;
                local_c8._M_dataplus._M_p = (pointer)*puVar13;
              }
              local_c8._M_string_length = puVar13[1];
              *puVar13 = psVar15;
              puVar13[1] = 0;
              *(undefined1 *)(puVar13 + 2) = 0;
              ::std::__cxx11::string::_M_append((char *)&access,(ulong)local_c8._M_dataplus._M_p);
              if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)local_c8._M_dataplus._M_p != &local_c8.field_2) {
                operator_delete(local_c8._M_dataplus._M_p);
              }
              if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)local_a8._M_dataplus._M_p != &local_a8.field_2) {
                operator_delete(local_a8._M_dataplus._M_p);
              }
              if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)__str._M_dataplus._M_p != &__str.field_2) {
                operator_delete(__str._M_dataplus._M_p);
              }
              (*(this->super_CompilerGLSL).super_Compiler._vptr_Compiler[0x14])
                        (&local_c8,this,(ulong)local_cc,3);
              (*(this->super_CompilerGLSL).super_Compiler._vptr_Compiler[6])
                        (&local_a8,this,(ulong)uVar4,1);
              CompilerGLSL::
              statement<char_const(&)[6],std::__cxx11::string,char_const(&)[2],unsigned_int_const&,char_const(&)[5],std::__cxx11::string,char_const(&)[8],std::__cxx11::string&,char_const(&)[2]>
                        (&this->super_CompilerGLSL,(char (*) [6])"spvV.",&local_c8,
                         (char (*) [2])0x3837e2,&orig_index,(char (*) [5])0x3980eb,&local_a8,
                         (char (*) [8])"[spvVI]",&access,(char (*) [2])0x397f80);
              if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)local_a8._M_dataplus._M_p != &local_a8.field_2) {
                operator_delete(local_a8._M_dataplus._M_p);
              }
              if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)local_c8._M_dataplus._M_p != &local_c8.field_2) {
                operator_delete(local_c8._M_dataplus._M_p);
              }
            }
          }
          CompilerGLSL::to_member_name_abi_cxx11_(&local_c8,&this->super_CompilerGLSL,pSVar9,uVar17)
          ;
          (*(this->super_CompilerGLSL).super_Compiler._vptr_Compiler[6])
                    (&local_a8,this,(ulong)uVar4,1);
          CompilerGLSL::
          statement<char_const(&)[6],std::__cxx11::string,char_const(&)[4],std::__cxx11::string,char_const(&)[8],std::__cxx11::string&,char_const(&)[2]>
                    (&this->super_CompilerGLSL,(char (*) [6])"spvV.",&local_c8,
                     (char (*) [4])0x3980ec,&local_a8,(char (*) [8])"[spvVI]",&access,
                     (char (*) [2])0x397f80);
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_a8._M_dataplus._M_p != &local_a8.field_2) {
            operator_delete(local_a8._M_dataplus._M_p);
          }
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_c8._M_dataplus._M_p != &local_c8.field_2) {
            operator_delete(local_c8._M_dataplus._M_p);
          }
          if ((local_cc == 0) && ((this->super_CompilerGLSL).options.vertex.flip_vert_y != false)) {
            CompilerGLSL::to_member_name_abi_cxx11_
                      (&local_c8,&this->super_CompilerGLSL,pSVar9,uVar17);
            CompilerGLSL::to_member_name_abi_cxx11_
                      (&local_a8,&this->super_CompilerGLSL,pSVar9,uVar17);
            CompilerGLSL::
            statement<char_const(&)[6],std::__cxx11::string,char_const(&)[8],char_const(&)[6],std::__cxx11::string,char_const(&)[5],char_const(&)[31]>
                      (&this->super_CompilerGLSL,(char (*) [6])"spvV.",&local_c8,
                       (char (*) [8])".y = -(",(char (*) [6])"spvV.",&local_a8,
                       (char (*) [5])0x397ce2,(char (*) [31])"    // Invert Y-axis for Metal");
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_a8._M_dataplus._M_p != &local_a8.field_2) {
              operator_delete(local_a8._M_dataplus._M_p);
            }
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_c8._M_dataplus._M_p != &local_c8.field_2) {
              operator_delete(local_c8._M_dataplus._M_p);
            }
          }
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)access._M_dataplus._M_p != &access.field_2) {
            operator_delete(access._M_dataplus._M_p);
          }
        }
        uVar17 = uVar17 + 1;
      } while (uVar17 < (uint)(pSVar9->member_types).
                              super_VectorView<spirv_cross::TypedID<(spirv_cross::Types)1>_>.
                              buffer_size);
    }
    CompilerGLSL::statement<char_const(&)[33]>
              (&this->super_CompilerGLSL,(char (*) [33])"spvMesh.set_vertex(spvVI, spvV);");
    CompilerGLSL::end_scope(&this->super_CompilerGLSL);
  }
  if (this->builtin_mesh_primitive_indices_id != 0 || (this->mesh_out_per_primitive).id != 0) {
    if (uVar16 < pSVar7->output_primitives) {
      CompilerGLSL::statement<char_const(&)[92]>
                (&this->super_CompilerGLSL,
                 (char (*) [92])
                 "for (uint spvPI = gl_LocalInvocationIndex; spvPI < spvMeshSizes.y; spvPI += spvThreadCount)"
                );
    }
    else {
      CompilerGLSL::statement<char_const(&)[44]>
                (&this->super_CompilerGLSL,
                 (char (*) [44])"const uint spvPI = gl_LocalInvocationIndex;");
      CompilerGLSL::statement<char_const(&)[46]>
                (&this->super_CompilerGLSL,
                 (char (*) [46])"if (gl_LocalInvocationIndex < spvMeshSizes.y)");
    }
    CompilerGLSL::begin_scope(&this->super_CompilerGLSL);
    if (this->builtin_mesh_primitive_indices_id != 0) {
      access._M_dataplus._M_p._0_4_ = 0x14b2;
      this_00 = &(pSVar7->flags).higher;
      cVar14 = ::std::
               _Hashtable<unsigned_int,_unsigned_int,_std::allocator<unsigned_int>,_std::__detail::_Identity,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_true,_true>_>
               ::find(&this_00->_M_h,(key_type *)&access);
      if (cVar14.super__Node_iterator_base<unsigned_int,_false>._M_cur == (__node_type *)0x0) {
        access._M_dataplus._M_p._0_4_ = 0x1495;
        cVar14 = ::std::
                 _Hashtable<unsigned_int,_unsigned_int,_std::allocator<unsigned_int>,_std::__detail::_Identity,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_true,_true>_>
                 ::find(&this_00->_M_h,(key_type *)&access);
        if (cVar14.super__Node_iterator_base<unsigned_int,_false>._M_cur == (__node_type *)0x0) {
          CompilerGLSL::statement<char_const(&)[62]>
                    (&this->super_CompilerGLSL,
                     (char (*) [62])"spvMesh.set_index(spvPI, gl_PrimitivePointIndicesEXT[spvPI]);")
          ;
        }
        else {
          CompilerGLSL::statement<char_const(&)[73]>
                    (&this->super_CompilerGLSL,
                     (char (*) [73])
                     "spvMesh.set_index(spvPI * 2u + 0u, gl_PrimitiveLineIndicesEXT[spvPI].x);");
          CompilerGLSL::statement<char_const(&)[73]>
                    (&this->super_CompilerGLSL,
                     (char (*) [73])
                     "spvMesh.set_index(spvPI * 2u + 1u, gl_PrimitiveLineIndicesEXT[spvPI].y);");
        }
      }
      else {
        CompilerGLSL::statement<char_const(&)[77]>
                  (&this->super_CompilerGLSL,
                   (char (*) [77])
                   "spvMesh.set_index(spvPI * 3u + 0u, gl_PrimitiveTriangleIndicesEXT[spvPI].x);");
        CompilerGLSL::statement<char_const(&)[77]>
                  (&this->super_CompilerGLSL,
                   (char (*) [77])
                   "spvMesh.set_index(spvPI * 3u + 1u, gl_PrimitiveTriangleIndicesEXT[spvPI].y);");
        CompilerGLSL::statement<char_const(&)[77]>
                  (&this->super_CompilerGLSL,
                   (char (*) [77])
                   "spvMesh.set_index(spvPI * 3u + 2u, gl_PrimitiveTriangleIndicesEXT[spvPI].z);");
      }
    }
    uVar8 = (ulong)(this->mesh_out_per_primitive).id;
    if (uVar8 != 0) {
      pSVar9 = Variant::get<spirv_cross::SPIRType>
                         ((this->super_CompilerGLSL).super_Compiler.ir.ids.
                          super_VectorView<spirv_cross::Variant>.ptr + uVar8);
      CompilerGLSL::statement<char_const(&)[27]>
                (&this->super_CompilerGLSL,(char (*) [27])"spvPerPrimitive spvP = {};");
      if ((int)(pSVar9->member_types).super_VectorView<spirv_cross::TypedID<(spirv_cross::Types)1>_>
               .buffer_size != 0) {
        uVar17 = 0;
        do {
          uVar4 = Compiler::get_extended_member_decoration
                            ((Compiler *)this,(pSVar9->super_IVariant).self.id,uVar17,
                             SPIRVCrossDecorationInterfaceOrigID);
          uVar5 = Compiler::get_extended_member_decoration
                            ((Compiler *)this,(pSVar9->super_IVariant).self.id,uVar17,
                             SPIRVCrossDecorationInterfaceMemberIndex);
          pSVar10 = Variant::get<spirv_cross::SPIRVariable>
                              ((this->super_CompilerGLSL).super_Compiler.ir.ids.
                               super_VectorView<spirv_cross::Variant>.ptr + uVar4);
          pSVar11 = Variant::get<spirv_cross::SPIRType>
                              ((this->super_CompilerGLSL).super_Compiler.ir.ids.
                               super_VectorView<spirv_cross::Variant>.ptr +
                               *(uint *)&(pSVar10->super_IVariant).field_0xc);
          access._M_dataplus._M_p = (pointer)&access.field_2;
          access._M_string_length = 0;
          access.field_2._M_local_buf[0] = '\0';
          if (pSVar11->basetype == Struct) {
            bVar2 = Compiler::has_member_decoration
                              ((Compiler *)this,(TypeID)(pSVar11->super_IVariant).self.id,uVar5,
                               BuiltIn);
            if ((bVar2) &&
               ((((uVar6 = Compiler::get_member_decoration
                                     ((Compiler *)this,(TypeID)(pSVar11->super_IVariant).self.id,
                                      uVar5,BuiltIn), uVar6 < 0xb &&
                  ((0x680U >> (uVar6 & 0x1f) & 1) != 0)) || (uVar6 == 0x14b3)) || (uVar6 == 0x1150))
               )) {
              (*(this->super_CompilerGLSL).super_Compiler._vptr_Compiler[0x14])
                        (&local_a8,this,(ulong)uVar6,3);
              puVar13 = (undefined8 *)
                        ::std::__cxx11::string::replace((ulong)&local_a8,0,(char *)0x0,0x34fc6b);
              psVar15 = puVar13 + 2;
              if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)*puVar13 ==
                  (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)psVar15) {
                local_c8.field_2._M_allocated_capacity = *psVar15;
                local_c8.field_2._8_8_ = puVar13[3];
                local_c8._M_dataplus._M_p = (pointer)&local_c8.field_2;
              }
              else {
                local_c8.field_2._M_allocated_capacity = *psVar15;
                local_c8._M_dataplus._M_p = (pointer)*puVar13;
              }
              local_c8._M_string_length = puVar13[1];
              *puVar13 = psVar15;
              puVar13[1] = 0;
              *(undefined1 *)(puVar13 + 2) = 0;
              ::std::__cxx11::string::operator=((string *)&access,(string *)&local_c8);
              if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)local_c8._M_dataplus._M_p != &local_c8.field_2) {
                operator_delete(local_c8._M_dataplus._M_p);
              }
              if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)local_a8._M_dataplus._M_p != &local_a8.field_2) {
LAB_0025be94:
                operator_delete(local_a8._M_dataplus._M_p);
              }
            }
            else {
              CompilerGLSL::to_member_name_abi_cxx11_
                        (&local_a8,&this->super_CompilerGLSL,pSVar11,uVar5);
              puVar13 = (undefined8 *)
                        ::std::__cxx11::string::replace((ulong)&local_a8,0,(char *)0x0,0x34fc6b);
              psVar15 = puVar13 + 2;
              if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)*puVar13 ==
                  (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)psVar15) {
                local_c8.field_2._M_allocated_capacity = *psVar15;
                local_c8.field_2._8_8_ = puVar13[3];
                local_c8._M_dataplus._M_p = (pointer)&local_c8.field_2;
              }
              else {
                local_c8.field_2._M_allocated_capacity = *psVar15;
                local_c8._M_dataplus._M_p = (pointer)*puVar13;
              }
              local_c8._M_string_length = puVar13[1];
              *puVar13 = psVar15;
              puVar13[1] = 0;
              *(undefined1 *)(puVar13 + 2) = 0;
              ::std::__cxx11::string::operator=((string *)&access,(string *)&local_c8);
              if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)local_c8._M_dataplus._M_p != &local_c8.field_2) {
                operator_delete(local_c8._M_dataplus._M_p);
              }
              if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)local_a8._M_dataplus._M_p != &local_a8.field_2) goto LAB_0025be94;
            }
          }
          CompilerGLSL::to_member_name_abi_cxx11_(&local_c8,&this->super_CompilerGLSL,pSVar9,uVar17)
          ;
          (*(this->super_CompilerGLSL).super_Compiler._vptr_Compiler[6])
                    (&local_a8,this,(ulong)uVar4,1);
          CompilerGLSL::
          statement<char_const(&)[6],std::__cxx11::string,char_const(&)[4],std::__cxx11::string,char_const(&)[8],std::__cxx11::string&,char_const(&)[2]>
                    (&this->super_CompilerGLSL,(char (*) [6])"spvP.",&local_c8,
                     (char (*) [4])0x3980ec,&local_a8,(char (*) [8])"[spvPI]",&access,
                     (char (*) [2])0x397f80);
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_a8._M_dataplus._M_p != &local_a8.field_2) {
            operator_delete(local_a8._M_dataplus._M_p);
          }
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_c8._M_dataplus._M_p != &local_c8.field_2) {
            operator_delete(local_c8._M_dataplus._M_p);
          }
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)access._M_dataplus._M_p != &access.field_2) {
            operator_delete(access._M_dataplus._M_p);
          }
          uVar17 = uVar17 + 1;
        } while (uVar17 < (uint)(pSVar9->member_types).
                                super_VectorView<spirv_cross::TypedID<(spirv_cross::Types)1>_>.
                                buffer_size);
      }
      CompilerGLSL::statement<char_const(&)[36]>
                (&this->super_CompilerGLSL,(char (*) [36])"spvMesh.set_primitive(spvPI, spvP);");
    }
    CompilerGLSL::end_scope(&this->super_CompilerGLSL);
  }
  return;
}

Assistant:

void CompilerMSL::emit_mesh_outputs()
{
	auto &mode = get_entry_point();

	// predefined thread count or zero, if specialization constant is in use
	uint32_t num_invocations = 0;
	if (mode.workgroup_size.id_x == 0 && mode.workgroup_size.id_y == 0 && mode.workgroup_size.id_z == 0)
		num_invocations = mode.workgroup_size.x * mode.workgroup_size.y * mode.workgroup_size.z;

	statement("threadgroup_barrier(mem_flags::mem_threadgroup);");
	statement("if (spvMeshSizes.y == 0)");
	begin_scope();
	statement("return;");
	end_scope();
	statement("spvMesh.set_primitive_count(spvMeshSizes.y);");

	statement("const uint spvThreadCount [[maybe_unused]] = (gl_WorkGroupSize.x * gl_WorkGroupSize.y * gl_WorkGroupSize.z);");

	if (mesh_out_per_vertex != 0)
	{
		auto &type_vert = get<SPIRType>(mesh_out_per_vertex);

		if (num_invocations < mode.output_vertices)
		{
			statement("for (uint spvVI = gl_LocalInvocationIndex; spvVI < spvMeshSizes.x; spvVI += spvThreadCount)");
		}
		else
		{
			statement("const uint spvVI = gl_LocalInvocationIndex;");
			statement("if (gl_LocalInvocationIndex < spvMeshSizes.x)");
		}

		begin_scope();

		statement("spvPerVertex spvV = {};");
		for (uint32_t index = 0; index < uint32_t(type_vert.member_types.size()); ++index)
		{
			uint32_t orig_var = get_extended_member_decoration(type_vert.self, index, SPIRVCrossDecorationInterfaceOrigID);
			uint32_t orig_id = get_extended_member_decoration(type_vert.self, index, SPIRVCrossDecorationInterfaceMemberIndex);

			// Clip/cull distances are special-case
			if (orig_var == 0 && orig_id == (~0u))
				continue;

			auto &orig = get<SPIRVariable>(orig_var);
			auto &orig_type = get<SPIRType>(orig.basetype);

			// FIXME: Need to deal with complex composite IO types. These may need extra unroll, etc.

			BuiltIn builtin = BuiltInMax;
			std::string access;
			if (orig_type.basetype == SPIRType::Struct)
			{
				if (has_member_decoration(orig_type.self, orig_id, DecorationBuiltIn))
					builtin = BuiltIn(get_member_decoration(orig_type.self, orig_id, DecorationBuiltIn));

				switch (builtin)
				{
				case BuiltInPosition:
				case BuiltInPointSize:
				case BuiltInClipDistance:
				case BuiltInCullDistance:
					access = "." + builtin_to_glsl(builtin, StorageClassOutput);
					break;
				default:
					access = "." + to_member_name(orig_type, orig_id);
					break;
				}

				if (has_member_decoration(type_vert.self, index, DecorationIndex))
				{
					// Declare the Clip/CullDistance as [[user(clip/cullN)]].
					const uint32_t orig_index = get_member_decoration(type_vert.self, index, DecorationIndex);
					access += "[" + to_string(orig_index) + "]";
					statement("spvV.", builtin_to_glsl(builtin, StorageClassOutput), "[", orig_index, "] = ", to_name(orig_var), "[spvVI]", access, ";");
				}
			}

			statement("spvV.", to_member_name(type_vert, index), " = ", to_name(orig_var), "[spvVI]", access, ";");
			if (options.vertex.flip_vert_y && builtin == BuiltInPosition)
			{
				statement("spvV.", to_member_name(type_vert, index), ".y = -(", "spvV.",
				          to_member_name(type_vert, index), ".y);", "    // Invert Y-axis for Metal");
			}
		}
		statement("spvMesh.set_vertex(spvVI, spvV);");
		end_scope();
	}

	if (mesh_out_per_primitive != 0 || builtin_mesh_primitive_indices_id != 0)
	{
		if (num_invocations < mode.output_primitives)
		{
			statement("for (uint spvPI = gl_LocalInvocationIndex; spvPI < spvMeshSizes.y; spvPI += spvThreadCount)");
		}
		else
		{
			statement("const uint spvPI = gl_LocalInvocationIndex;");
			statement("if (gl_LocalInvocationIndex < spvMeshSizes.y)");
		}

		// FIXME: Need to deal with complex composite IO types. These may need extra unroll, etc.

		begin_scope();

		if (builtin_mesh_primitive_indices_id != 0)
		{
			if (mode.flags.get(ExecutionModeOutputTrianglesEXT))
			{
				statement("spvMesh.set_index(spvPI * 3u + 0u, gl_PrimitiveTriangleIndicesEXT[spvPI].x);");
				statement("spvMesh.set_index(spvPI * 3u + 1u, gl_PrimitiveTriangleIndicesEXT[spvPI].y);");
				statement("spvMesh.set_index(spvPI * 3u + 2u, gl_PrimitiveTriangleIndicesEXT[spvPI].z);");
			}
			else if (mode.flags.get(ExecutionModeOutputLinesEXT))
			{
				statement("spvMesh.set_index(spvPI * 2u + 0u, gl_PrimitiveLineIndicesEXT[spvPI].x);");
				statement("spvMesh.set_index(spvPI * 2u + 1u, gl_PrimitiveLineIndicesEXT[spvPI].y);");
			}
			else
			{
				statement("spvMesh.set_index(spvPI, gl_PrimitivePointIndicesEXT[spvPI]);");
			}
		}

		if (mesh_out_per_primitive != 0)
		{
			auto &type_prim = get<SPIRType>(mesh_out_per_primitive);
			statement("spvPerPrimitive spvP = {};");
			for (uint32_t index = 0; index < uint32_t(type_prim.member_types.size()); ++index)
			{
				uint32_t orig_var =
						get_extended_member_decoration(type_prim.self, index, SPIRVCrossDecorationInterfaceOrigID);
				uint32_t orig_id =
						get_extended_member_decoration(type_prim.self, index, SPIRVCrossDecorationInterfaceMemberIndex);
				auto &orig = get<SPIRVariable>(orig_var);
				auto &orig_type = get<SPIRType>(orig.basetype);

				BuiltIn builtin = BuiltInMax;
				std::string access;
				if (orig_type.basetype == SPIRType::Struct)
				{
					if (has_member_decoration(orig_type.self, orig_id, DecorationBuiltIn))
						builtin = BuiltIn(get_member_decoration(orig_type.self, orig_id, DecorationBuiltIn));

					switch (builtin)
					{
					case BuiltInPrimitiveId:
					case BuiltInLayer:
					case BuiltInViewportIndex:
					case BuiltInCullPrimitiveEXT:
					case BuiltInPrimitiveShadingRateKHR:
						access = "." + builtin_to_glsl(builtin, StorageClassOutput);
						break;
					default:
						access = "." + to_member_name(orig_type, orig_id);
					}
				}
				statement("spvP.", to_member_name(type_prim, index), " = ", to_name(orig_var), "[spvPI]", access, ";");
			}
			statement("spvMesh.set_primitive(spvPI, spvP);");
		}

		end_scope();
	}
}